

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O0

Address * __thiscall Settings::getProxyAddr(Settings *this,String *destination_)

{
  Iterator this_00;
  bool bVar1;
  Iterator *pIVar2;
  char *pcVar3;
  char *pcVar4;
  Array<Address> *pAVar5;
  String local_a0;
  char *local_78;
  char *x_1;
  Item *local_60;
  undefined1 local_58 [8];
  String destination;
  char *x;
  Iterator it;
  String *destination__local;
  Settings *this_local;
  
  it.item = (Item *)destination_;
  x = (char *)HashMap<String,_Array<Address>_>::find(&this->_destinationHttpProxyAddrs,destination_)
  ;
  pIVar2 = HashMap<String,_Array<Address>_>::end(&this->_destinationHttpProxyAddrs);
  bVar1 = HashMap<String,_Array<Address>_>::Iterator::operator!=((Iterator *)&x,pIVar2);
  if (bVar1) {
    pAVar5 = HashMap<String,_Array<Address>_>::Iterator::operator*((Iterator *)&x);
    this_local = (Settings *)anon_unknown.dwarf_e26d::getRandomProxyAddr(pAVar5);
  }
  else {
    pcVar3 = String::find(&(it.item)->key,'.');
    this_00 = it;
    destination._data.ref = (usize)pcVar3;
    if (pcVar3 != (char *)0x0) {
      pcVar4 = String::operator_cast_to_char_(&(it.item)->key);
      String::substr((String *)local_58,&(this_00.item)->key,(ssize)(pcVar3 + (1 - (long)pcVar4)),-1
                    );
      while( true ) {
        local_60 = (Item *)HashMap<String,_Array<Address>_>::find
                                     (&this->_destinationHttpProxyAddrs,(String *)local_58);
        x = (char *)local_60;
        pIVar2 = HashMap<String,_Array<Address>_>::end(&this->_destinationHttpProxyAddrs);
        bVar1 = HashMap<String,_Array<Address>_>::Iterator::operator!=((Iterator *)&x,pIVar2);
        if (bVar1) break;
        pcVar3 = String::find((String *)local_58,'.');
        local_78 = pcVar3;
        if (pcVar3 == (char *)0x0) {
          x_1._0_4_ = 0;
          goto LAB_0010d664;
        }
        pcVar4 = String::operator_cast_to_char_((String *)local_58);
        String::substr(&local_a0,(String *)local_58,(ssize)(pcVar3 + (1 - (long)pcVar4)),-1);
        String::operator=((String *)local_58,&local_a0);
        String::~String(&local_a0);
      }
      pAVar5 = HashMap<String,_Array<Address>_>::Iterator::operator*((Iterator *)&x);
      this_local = (Settings *)anon_unknown.dwarf_e26d::getRandomProxyAddr(pAVar5);
      x_1._0_4_ = 1;
LAB_0010d664:
      String::~String((String *)local_58);
      if ((int)x_1 != 0) {
        return &this_local->_listenAddr;
      }
    }
    this_local = (Settings *)anon_unknown.dwarf_e26d::getRandomProxyAddr(&this->_httpProxyAddrs);
  }
  return &this_local->_listenAddr;
}

Assistant:

const Address& Settings::getProxyAddr(const String& destination_)
{
    DestinationHttpProxyAddrsMap::Iterator it = _destinationHttpProxyAddrs.find(destination_);
    if (it != _destinationHttpProxyAddrs.end())
        return getRandomProxyAddr(*it);
    if (const char* x = destination_.find('.'))
    {
        String destination = destination_.substr(x - (const char*)destination_ + 1);
        for (;;)
        {
            it = _destinationHttpProxyAddrs.find(destination);
            if (it != _destinationHttpProxyAddrs.end())
                return getRandomProxyAddr(*it);
            const char* x = destination.find('.');
            if (!x)
                break;
            destination = destination.substr(x - (const char*)destination + 1);
        }
    }
    return getRandomProxyAddr(_httpProxyAddrs);
}